

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O0

void __thiscall serialization::xml_oarchive::serialize_start(xml_oarchive *this)

{
  xml_node<char> *pxVar1;
  serialization_trace local_11;
  xml_oarchive *pxStack_10;
  serialization_trace trace;
  xml_oarchive *this_local;
  
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[16],char_const(&)[4]>
            (&local_11,(char (*) [16])0x14cafc,(char (*) [4])"xml");
  rapidxml::xml_document<char>::clear(&this->document_);
  pxVar1 = rapidxml::memory_pool<char>::allocate_node
                     (&(this->document_).super_memory_pool<char>,node_element,"serialization",
                      (char *)0x0,0,0);
  this->current_ = pxVar1;
  rapidxml::xml_node<char>::append_node((xml_node<char> *)this,this->current_);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void serialize_start()
    {
        serialization_trace trace(__func__, "xml");
        document_.clear();
        current_ = document_.allocate_node(rapidxml::node_element, "serialization");
        document_.append_node(current_);
        str_.clear();
    }